

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn3.cc
# Opt level: O0

void __thiscall trng::yarn3::yarn3(yarn3 *this,unsigned_long s,parameter_type P)

{
  int in_ECX;
  undefined8 in_RDX;
  unsigned_long in_RSI;
  yarn3 *in_RDI;
  
  *(undefined8 *)(in_RDI->P).a = in_RDX;
  (in_RDI->P).a[2] = in_ECX;
  mrg_status<int,_3,_trng::yarn3>::mrg_status(&in_RDI->S);
  seed(in_RDI,in_RSI);
  return;
}

Assistant:

yarn3::yarn3(unsigned long s, yarn3::parameter_type P) : P{P} { seed(s); }